

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IdleDecommitPageAllocator.cpp
# Opt level: O0

IdleDecommitSignal __thiscall
Memory::IdleDecommitPageAllocator::LeaveIdleDecommit
          (IdleDecommitPageAllocator *this,bool allowTimer)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  DWORD DVar4;
  DWORD DVar5;
  undefined4 *puVar6;
  ThreadContextId pvVar7;
  IdleDecommitSignal local_38;
  int timeDiff;
  IdleDecommitSignal idleDecommitSignal;
  AutoResetWaitingToEnterIdleDecommitFlag local_28;
  AutoResetWaitingToEnterIdleDecommitFlag autoResetWaitingToEnterIdleDecommitFlag;
  bool allowTimer_local;
  IdleDecommitPageAllocator *this_local;
  
  autoResetWaitingToEnterIdleDecommitFlag.pageAllocator._7_1_ = allowTimer;
  if ((this->super_PageAllocator).idleDecommitEnterCount == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/IdleDecommitPageAllocator.cpp"
                       ,0x62,"(this->idleDecommitEnterCount > 0)","this->idleDecommitEnterCount > 0"
                      );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if ((this->super_PageAllocator).maxFreePageCount != this->maxIdleDecommitFreePageCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/IdleDecommitPageAllocator.cpp"
                       ,99,"(this->maxFreePageCount == maxIdleDecommitFreePageCount)",
                       "this->maxFreePageCount == maxIdleDecommitFreePageCount");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if ((this->hasDecommitTimer & 1U) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/IdleDecommitPageAllocator.cpp"
                       ,0x6b,"(!hasDecommitTimer)","!hasDecommitTimer");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  (this->super_PageAllocator).idleDecommitEnterCount =
       (this->super_PageAllocator).idleDecommitEnterCount - 1;
  if ((this->super_PageAllocator).idleDecommitEnterCount == 0) {
    if ((autoResetWaitingToEnterIdleDecommitFlag.pageAllocator._7_1_ & 1) == 0) {
      (this->super_PageAllocator).maxFreePageCount = this->maxNonIdleDecommitFreePageCount;
      PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
      ::DecommitNow(&this->super_PageAllocator,true);
      PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
      ::ClearMinFreePageCount(&this->super_PageAllocator);
      this_local._4_4_ = IdleDecommitSignal_None;
    }
    else {
      bVar3 = CCLock::TryEnter(&(this->cs).super_CCLock);
      if (!bVar3) {
        AutoResetWaitingToEnterIdleDecommitFlag::AutoResetWaitingToEnterIdleDecommitFlag
                  (&local_28,this);
        CCLock::Enter(&(this->cs).super_CCLock);
        AutoResetWaitingToEnterIdleDecommitFlag::~AutoResetWaitingToEnterIdleDecommitFlag(&local_28)
        ;
      }
      bVar3 = Js::Phases::IsEnabled
                        (&((this->super_PageAllocator).pageAllocatorFlagTable)->Trace,
                         PageAllocatorPhase);
      if ((bVar3) && ((((this->super_PageAllocator).pageAllocatorFlagTable)->Verbose & 1U) != 0)) {
        pvVar7 = GetCurrentThreadContextId();
        DVar4 = GetCurrentThreadId();
        Output::Print(L"%p : %p> PageAllocator(%p): ",pvVar7,(ulong)DVar4,this);
        if ((this->super_PageAllocator).debugName != (char16 *)0x0) {
          Output::Print(L"[%s] ",(this->super_PageAllocator).debugName);
        }
        Output::Print(L"LeaveIdleDecommit");
        Output::Print(L"\n");
        Output::Flush();
      }
      if (this->maxIdleDecommitFreePageCount == this->maxNonIdleDecommitFreePageCount) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/IdleDecommitPageAllocator.cpp"
                           ,0x8c,"(maxIdleDecommitFreePageCount != maxNonIdleDecommitFreePageCount)"
                           ,"maxIdleDecommitFreePageCount != maxNonIdleDecommitFreePageCount");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      local_38 = IdleDecommitSignal_None;
      if ((((this->super_PageAllocator).freePageCount == 0) &&
          (((this->super_PageAllocator).isUsed & 1U) == 0)) && ((this->hadDecommitTimer & 1U) == 0))
      {
        if ((this->super_PageAllocator).minFreePageCount != 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/IdleDecommitPageAllocator.cpp"
                             ,0x91,"(minFreePageCount == 0)","minFreePageCount == 0");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        if ((this->super_PageAllocator).minFreePageCount !=
            (this->super_PageAllocator).debugMinFreePageCount) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/IdleDecommitPageAllocator.cpp"
                             ,0x92,"(minFreePageCount == debugMinFreePageCount)",
                             "minFreePageCount == debugMinFreePageCount");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        (this->super_PageAllocator).maxFreePageCount = this->maxNonIdleDecommitFreePageCount;
      }
      else {
        PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
        ::UpdateMinFreePageCount(&this->super_PageAllocator);
        this->hasDecommitTimer = true;
        local_38 = IdleDecommitSignal_NeedTimer;
        if (((this->super_PageAllocator).isUsed & 1U) == 0) {
          DVar4 = this->decommitTime;
          DVar5 = GetTickCount();
          if ((int)(DVar4 - DVar5) < 0x14) {
            local_38 = IdleDecommitSignal_NeedSignal;
          }
          bVar3 = Js::Phases::IsEnabled
                            (&((this->super_PageAllocator).pageAllocatorFlagTable)->Trace,
                             PageAllocatorPhase);
          if (bVar3) {
            pvVar7 = GetCurrentThreadContextId();
            DVar4 = GetCurrentThreadId();
            Output::Print(L"%p : %p> PageAllocator(%p): ",pvVar7,(ulong)DVar4,this);
            if ((this->super_PageAllocator).debugName != (char16 *)0x0) {
              Output::Print(L"[%s] ",(this->super_PageAllocator).debugName);
            }
            uVar1 = this->decommitTime;
            DVar4 = this->decommitTime;
            DVar5 = GetTickCount();
            Output::Print(L"Reschedule idle decommit at %d (%d)",(ulong)uVar1,(ulong)(DVar4 - DVar5)
                         );
            Output::Print(L"\n");
            Output::Flush();
          }
        }
        else {
          DVar4 = GetTickCount();
          this->decommitTime = DVar4 + 1000;
          bVar3 = Js::Phases::IsEnabled
                            (&((this->super_PageAllocator).pageAllocatorFlagTable)->Trace,
                             PageAllocatorPhase);
          if (bVar3) {
            pvVar7 = GetCurrentThreadContextId();
            DVar4 = GetCurrentThreadId();
            Output::Print(L"%p : %p> PageAllocator(%p): ",pvVar7,(ulong)DVar4,this);
            if ((this->super_PageAllocator).debugName != (char16 *)0x0) {
              Output::Print(L"[%s] ",(this->super_PageAllocator).debugName);
            }
            Output::Print(L"Schedule idle decommit at %d (%d)",(ulong)this->decommitTime,1000);
            Output::Print(L"\n");
            Output::Flush();
          }
        }
      }
      CCLock::Leave(&(this->cs).super_CCLock);
      this_local._4_4_ = local_38;
    }
  }
  else {
    this_local._4_4_ = IdleDecommitSignal_None;
  }
  return this_local._4_4_;
}

Assistant:

IdleDecommitSignal
IdleDecommitPageAllocator::LeaveIdleDecommit(bool allowTimer)
{
    Assert(this->idleDecommitEnterCount > 0);
    Assert(this->maxFreePageCount == maxIdleDecommitFreePageCount);

#ifdef ENABLE_BASIC_TELEMETRY
    AllocatorDecommitStats * decommitStats = this->GetDecommitStats();
    decommitStats->lastLeaveDecommitRegion = Js::Tick::Now();
#endif

#ifdef IDLE_DECOMMIT_ENABLED
    Assert(!hasDecommitTimer);
#endif

    this->idleDecommitEnterCount--;
    if (this->idleDecommitEnterCount != 0)
    {
        return IdleDecommitSignal_None;
    }

#ifdef IDLE_DECOMMIT_ENABLED
    if (allowTimer)
    {
        if (!cs.TryEnter())
        {
            AutoResetWaitingToEnterIdleDecommitFlag autoResetWaitingToEnterIdleDecommitFlag(this);

#ifdef ENABLE_BASIC_TELEMETRY
            decommitStats->lastEnterLeaveIdleDecommitTick = Js::Tick::Now();
#endif

            cs.Enter();

#ifdef ENABLE_BASIC_TELEMETRY
            decommitStats->lastEnterLeaveIdleDecommitCSWaitTime = Js::Tick::Now() - decommitStats->lastEnterLeaveIdleDecommitTick;
            decommitStats->totalEnterLeaveIdleDecommitCSWaitTime += decommitStats->lastEnterLeaveIdleDecommitCSWaitTime;
            if (decommitStats->lastEnterLeaveIdleDecommitCSWaitTime > decommitStats->maxEnterLeaveIdleDecommitCSWaitTime)
            {
                decommitStats->maxEnterLeaveIdleDecommitCSWaitTime = decommitStats->lastEnterLeaveIdleDecommitCSWaitTime;
            }
#endif
        }

        PAGE_ALLOC_VERBOSE_TRACE(_u("LeaveIdleDecommit"));
        Assert(maxIdleDecommitFreePageCount != maxNonIdleDecommitFreePageCount);

        IdleDecommitSignal idleDecommitSignal = IdleDecommitSignal_None;
        if (freePageCount == 0 && !isUsed && !hadDecommitTimer)
        {
            Assert(minFreePageCount == 0);
            Assert(minFreePageCount == debugMinFreePageCount);

            // Nothing to decommit, it isn't used, and there was no timer before.
            // Just switch it back to non idle decommit mode
            this->maxFreePageCount = maxNonIdleDecommitFreePageCount;
        }
        else
        {
            UpdateMinFreePageCount();

            hasDecommitTimer = true;
            idleDecommitSignal = IdleDecommitSignal_NeedTimer;

            if (isUsed)
            {
                // Reschedule the timer
                decommitTime = ::GetTickCount() + IdleDecommitTimeout;
                PAGE_ALLOC_TRACE( _u("Schedule idle decommit at %d (%d)"), decommitTime, IdleDecommitTimeout);
            }
            else
            {
                int timeDiff = (int)decommitTime - ::GetTickCount();
                if (timeDiff < 20)
                {
                    idleDecommitSignal = IdleDecommitSignal_NeedSignal;
                }

                PAGE_ALLOC_TRACE(_u("Reschedule idle decommit at %d (%d)"), decommitTime, decommitTime - ::GetTickCount());
            }

        }
        cs.Leave();
        return idleDecommitSignal;
    }
#endif
    this->maxFreePageCount = maxNonIdleDecommitFreePageCount;
    __super::DecommitNow();
    ClearMinFreePageCount();
    return IdleDecommitSignal_None;
}